

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
::reinit(best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
         *this,local_context *ctx,bool param_2,double kappa_min,double kappa_max,bit_array *x)

{
  double dVar1;
  value_type vVar2;
  baryonyx *pbVar3;
  double dVar4;
  reference pvVar5;
  double *in_R9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  double local_50;
  double kappa;
  char *local_40;
  bit_array *local_38;
  bit_array *x_local;
  double kappa_max_local;
  double kappa_min_local;
  local_context *plStack_18;
  bool param_2_local;
  local_context *ctx_local;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
  *this_local;
  
  pbVar3 = _stdout;
  local_38 = x;
  x_local = (bit_array *)kappa_max;
  kappa_max_local = kappa_min;
  kappa_min_local._7_1_ = param_2;
  plStack_18 = ctx;
  ctx_local = (local_context *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&kappa,
             "- reinitinialization thread {}.\n");
  fmt._M_str = &plStack_18->thread_id;
  fmt._M_len = (size_t)local_40;
  to_log<unsigned_int>(pbVar3,(FILE *)0x3,kappa._0_4_,fmt,(uint *)in_R9);
  local_50 = kappa_max_local;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->m_kappa_append,(ulong)plStack_18->thread_id);
  if (plStack_18->init_kappa_improve_stop <= *pvVar5) {
    vVar2 = plStack_18->init_kappa_improve_start;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_kappa_append,(ulong)plStack_18->thread_id);
    *pvVar5 = vVar2;
    crossover(this,plStack_18,local_38);
    pbVar3 = _stdout;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"- crossover\n");
    fmt_01._M_str = (char *)fmt._M_str;
    fmt_01._M_len = (size_t)local_70._M_str;
    to_log<>(pbVar3,(FILE *)0x5,(uint)local_70._M_len,fmt_01);
  }
  else {
    dVar1 = plStack_18->init_kappa_improve_increase;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_kappa_append,(ulong)plStack_18->thread_id);
    dVar4 = kappa_max_local;
    *pvVar5 = dVar1 + *pvVar5;
    dVar1 = (double)x_local - kappa_max_local;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_kappa_append,(ulong)plStack_18->thread_id);
    pbVar3 = _stdout;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar4;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *pvVar5;
    auVar6 = vfmadd213sd_fma(auVar6,auVar7,auVar8);
    local_50 = auVar6._0_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"- improve with kappa {}\n");
    fmt_00._M_str = (char *)&local_50;
    fmt_00._M_len = (size_t)local_60._M_str;
    to_log<double>(pbVar3,(FILE *)0x5,(uint)local_60._M_len,fmt_00,in_R9);
  }
  mutation(this,plStack_18,local_38);
  return local_50;
}

Assistant:

double reinit(local_context& ctx,
                  const bool /*is_solution*/,
                  const double kappa_min,
                  const double kappa_max,
                  bit_array& x)
    {
        to_log(stdout, 3u, "- reinitinialization thread {}.\n", ctx.thread_id);

        double kappa = kappa_min;

        if (m_kappa_append[ctx.thread_id] < ctx.init_kappa_improve_stop) {
            m_kappa_append[ctx.thread_id] += ctx.init_kappa_improve_increase;
            kappa = kappa_min +
                    (kappa_max - kappa_min) * m_kappa_append[ctx.thread_id];

            to_log(stdout, 5u, "- improve with kappa {}\n", kappa);
        } else {
            m_kappa_append[ctx.thread_id] = ctx.init_kappa_improve_start;
            crossover(ctx, x);

            to_log(stdout, 5u, "- crossover\n");
        }

        mutation(ctx, x);

        return kappa;
    }